

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O0

void __thiscall perf::suite::run(suite *this)

{
  bool bVar1;
  reference ppVar2;
  function<bool_()> *in_RDI;
  perf_case *c;
  iterator __end2;
  iterator __begin2;
  vector<perf::perf_case,_std::allocator<perf::perf_case>_> *__range2;
  time_point time_stop;
  time_point time_start;
  clock clk;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  type in_stack_ffffffffffffff88;
  __normal_iterator<perf::perf_case_*,_std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>_>
  local_40 [2];
  int local_2c;
  _Invoker_type local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_RDI);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_RDI);
  local_2c = 0;
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_28,&local_2c);
  in_RDI->_M_invoker = local_28;
  local_40[0]._M_current =
       (perf_case *)
       std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>::begin
                 ((vector<perf::perf_case,_std::allocator<perf::perf_case>_> *)
                  CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>::end
            ((vector<perf::perf_case,_std::allocator<perf::perf_case>_> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<perf::perf_case_*,_std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>_>
                        *)in_RDI,
                       (__normal_iterator<perf::perf_case_*,_std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<perf::perf_case_*,_std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>_>
             ::operator*(local_40);
    local_18 = std::chrono::_V2::system_clock::now();
    in_stack_ffffffffffffff7f = std::function<bool_()>::operator()(in_RDI);
    ppVar2->success = (bool)in_stack_ffffffffffffff7f;
    local_20 = std::chrono::_V2::system_clock::now();
    in_stack_ffffffffffffff88 =
         std::chrono::operator-
                   (in_stack_ffffffffffffff88.__r,
                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_RDI);
    (ppVar2->time).__r = in_stack_ffffffffffffff88.__r;
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_RDI,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)
               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    __gnu_cxx::
    __normal_iterator<perf::perf_case_*,_std::vector<perf::perf_case,_std::allocator<perf::perf_case>_>_>
    ::operator++(local_40);
  }
  return;
}

Assistant:

void run()
        {
            clock clk;
            time_point time_start, time_stop;
            m_total_time = nanoseconds(0);

            for (auto &c : m_cases)
            {
                time_start = clk.now();
                try
                {
                    c.success = c.f();
                }
                catch (...)
                {
                    c.success = false;
                }
                time_stop = clk.now();
                c.time = time_stop - time_start;
                m_total_time += c.time;
            }
        }